

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int var_to_scan_var(gen_ctx_t gen_ctx,MIR_reg_t var)

{
  size_t sVar1;
  MIR_reg_t var_local;
  gen_ctx_t gen_ctx_local;
  
  gen_ctx_local._4_4_ = var;
  if (gen_ctx->lr_ctx->scan_vars_num != 0) {
    sVar1 = VARR_intlength(gen_ctx->lr_ctx->var_to_scan_var_map);
    if (var < sVar1) {
      gen_ctx_local._4_4_ = VARR_intget(gen_ctx->lr_ctx->var_to_scan_var_map,(ulong)var);
    }
    else {
      gen_ctx_local._4_4_ = 0xffffffff;
    }
  }
  return gen_ctx_local._4_4_;
}

Assistant:

static int var_to_scan_var (gen_ctx_t gen_ctx, MIR_reg_t var) {
  if (scan_vars_num == 0) return (int) var;
  if (VARR_LENGTH (int, var_to_scan_var_map) <= var) return -1;
  return VARR_GET (int, var_to_scan_var_map, var);
}